

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::iz_dvx_fwk(HDual *this)

{
  int *piVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RDI;
  int i;
  int vr_n;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x80); local_c = local_c + 1) {
    piVar1 = HModel::getNonbasicFlag((HModel *)0x147d07);
    if (piVar1[local_c] == 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_c);
      *pvVar2 = 1;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_c);
      *pvVar2 = 0;
    }
  }
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x7c); local_10 = local_10 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x660),(long)local_10);
    *pvVar3 = 1.0;
  }
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  *(undefined1 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void HDual::iz_dvx_fwk() {
//Initialise the Devex framework: reference set is all basic variables
	for (int vr_n = 0; vr_n < numTot; vr_n++) {
		if (model->getNonbasicFlag()[vr_n])
			//			Nonbasic variables not in reference set
			dvx_ix[vr_n] = dvx_not_in_R;
		else
			//			Basic variables in reference set
			dvx_ix[vr_n] = dvx_in_R;
	}
	for (int i = 0; i < numRow; i++)
		dualRHS.workEdWt[i] = 1.0;
	n_dvx_it = 0;
	n_dvx_fwk += 1;
	nw_dvx_fwk = false;
}